

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int ftp_compress_open(char *url,int rwmode,int *handle)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ssize_t sVar4;
  uint uVar5;
  FILE *pFVar6;
  char *pcVar7;
  int sock;
  FILE *command;
  FILE *ftpfile;
  char errorstr [1200];
  int local_4fc;
  FILE *local_4f8;
  FILE *local_4f0;
  char local_4e8 [1208];
  
  closeftpfile = 0;
  closecommandfile = 0;
  closememfile = 0;
  closefdiskfile = 0;
  closediskfile = 0;
  if (rwmode != 0) {
    pcVar7 = "Compressed files must be r/o";
LAB_00137060:
    ffpmsg(pcVar7);
    return 0x68;
  }
  sVar3 = strlen(netoutfile);
  uVar5 = (uint)sVar3;
  if (uVar5 == 0) {
    pcVar7 = "Output file not set, shouldn\'t have happened (ftp_compress_open)";
    goto LAB_00137060;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)env);
  if (iVar1 != 0) {
    ffpmsg("Timeout (ftp_compress_open)");
    snprintf(local_4e8,0x4b0,"Download timeout exceeded: %d seconds",(ulong)net_timeout);
    ffpmsg(local_4e8);
    url = "   Timeout may be adjusted with fits_set_timeout";
    goto LAB_001371fd;
  }
  signal(0xe,signal_handler);
  alarm(net_timeout);
  iVar1 = ftp_open_network(url,(FILE **)&local_4f0,(FILE **)&local_4f8,&local_4fc);
  __stream = local_4f0;
  if (iVar1 == 0) {
    closeftpfile = closeftpfile + 1;
    closecommandfile = closecommandfile + 1;
    uVar2 = fgetc(local_4f0);
    ungetc((int)(char)uVar2,__stream);
    pcVar7 = strstr(url,".gz");
    if (((pcVar7 == (char *)0x0) && (pcVar7 = strstr(url,".Z"), (uVar2 & 0xff) != 0x1f)) &&
       (pcVar7 == (char *)0x0)) {
      url = "Can only compressed files here (ftp_compress_open)";
      goto LAB_001371fd;
    }
    if (netoutfile[0] == '!') {
      if (0 < (int)uVar5) {
        memmove(netoutfile,netoutfile + 1,(ulong)(uVar5 & 0x7fffffff));
      }
      file_remove(netoutfile);
    }
    iVar1 = file_create(netoutfile,handle);
    if (iVar1 != 0) {
      url = "Unable to create output file (ftp_compress_open)";
LAB_001371c5:
      ffpmsg(url);
      url = netoutfile;
      goto LAB_001371fd;
    }
    closediskfile = closediskfile + 1;
    alarm(net_timeout);
    pFVar6 = __stream;
    sVar3 = fread(local_4e8,1,0x4b0,__stream);
    iVar1 = (int)pFVar6;
    if (sVar3 != 0) {
      do {
        alarm(0);
        iVar1 = file_write(*handle,local_4e8,sVar3);
        if (iVar1 != 0) {
          ffpmsg("Error writing file (ftp_compres_open)");
          goto LAB_001371c5;
        }
        alarm(net_timeout);
        pFVar6 = __stream;
        sVar3 = fread(local_4e8,1,0x4b0,__stream);
        iVar1 = (int)pFVar6;
      } while (sVar3 != 0);
    }
    file_close(*handle);
    closediskfile = closediskfile + -1;
    fclose(__stream);
    closeftpfile = closeftpfile + -1;
    fclose(local_4f8);
    NET_SendRaw(local_4fc,"QUIT\r\n",6,iVar1);
    closecommandfile = closecommandfile + -1;
    diskfile = (FILE *)fopen(netoutfile,"r");
    if ((FILE *)diskfile == (FILE *)0x0) {
      ffpmsg("Unable to reopen disk file (ftp_compress_open)");
      pcVar7 = netoutfile;
      goto LAB_00137060;
    }
    closefdiskfile = closefdiskfile + 1;
    iVar1 = mem_create(url,handle);
    if (iVar1 == 0) {
      closememfile = closememfile + 1;
      iVar1 = mem_uncompress2mem(url,diskfile,*handle);
      fclose((FILE *)diskfile);
      closefdiskfile = closefdiskfile + -1;
      if (iVar1 == 0) {
        signal(0xe,(__sighandler_t)0x0);
        alarm(0);
        iVar1 = mem_seek(*handle,0);
        return iVar1;
      }
      url = "Error writing compressed memory file (ftp_compress_open)";
      goto LAB_001371fd;
    }
    pcVar7 = "Unable to create memory file (ftp_compress_open)";
  }
  else {
    alarm(0);
    pcVar7 = "Unable to open ftp file (ftp_compress_open)";
  }
  ffpmsg(pcVar7);
LAB_001371fd:
  ffpmsg(url);
  alarm(0);
  if (closeftpfile != 0) {
    fclose(local_4f0);
  }
  if ((closecommandfile != 0) && (fclose(local_4f8), -1 < local_4fc)) {
    uVar5 = 0;
    do {
      sVar4 = send(local_4fc,"QUIT\r\n" + uVar5,(long)(int)(6 - uVar5),0);
      if ((int)sVar4 < 1) break;
      uVar5 = uVar5 + (int)sVar4;
    } while ((int)uVar5 < 6);
  }
  if (closefdiskfile != 0) {
    fclose((FILE *)diskfile);
  }
  if (closememfile != 0) {
    mem_close_free(*handle);
  }
  if (closediskfile != 0) {
    file_close(*handle);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int ftp_compress_open(char *url, int rwmode, int *handle)
{
  FILE *ftpfile;
  FILE *command;
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int ii, flen, status;
  int sock;
  char firstchar;

  closeftpfile = 0;
  closecommandfile = 0;
  closememfile = 0;
  closefdiskfile = 0;
  closediskfile = 0;

  /* don't do r/w files */
  if (rwmode != 0) {
    ffpmsg("Compressed files must be r/o");
    return (FILE_NOT_OPENED);
  }
  
  /* Need to know where to write the output file */
  flen = strlen(netoutfile);
  if (!flen) 
    {
      ffpmsg(
	"Output file not set, shouldn't have happened (ftp_compress_open)");
      return (FILE_NOT_OPENED);
    }
  
  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (ftp_compress_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }
  
  signal(SIGALRM, signal_handler);
  
  /* Open the network connection to url, ftpfile is connected to the file 
     port, command is connected to port 21.  sock is for writing to port 21 */
  alarm(net_timeout);

  if ((status = ftp_open_network(url,&ftpfile,&command,&sock))) {
    alarm(0);
    ffpmsg("Unable to open ftp file (ftp_compress_open)");
    ffpmsg(url);
    goto error;
  }
  closeftpfile++;
  closecommandfile++;

  /* Now, what do we do with the file */
  firstchar = fgetc(ftpfile);
  ungetc(firstchar,ftpfile);

  if (strstr(url,".gz") || 
      strstr(url,".Z") ||
      ('\037' == firstchar)) {
  
    if (*netoutfile == '!')
    {
       /* user wants to clobber file, if it already exists */
       for (ii = 0; ii < flen; ii++)
          netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

       status = file_remove(netoutfile);
    }

    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (ftp_compress_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closediskfile++;
    
    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,ftpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error writing file (ftp_compres_open)");
        ffpmsg(url);
        ffpmsg(netoutfile);
	goto error;
      }
      alarm(net_timeout);
    }

    file_close(*handle);
    closediskfile--;
    fclose(ftpfile);
    closeftpfile--;
    /* Close down the ftp connection */
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    closecommandfile--;

    /* File is on disk, let's uncompress it into memory */

    if (NULL == (diskfile = fopen(netoutfile,"r"))) {
      ffpmsg("Unable to reopen disk file (ftp_compress_open)");
      ffpmsg(netoutfile);
      return (FILE_NOT_OPENED);
    }
    closefdiskfile++;
  
    if ((status =  mem_create(url,handle))) {
      ffpmsg("Unable to create memory file (ftp_compress_open)");
      ffpmsg(url);
      goto error;
    }
    closememfile++;

    status = 0;
    status = mem_uncompress2mem(url,diskfile,*handle);
    fclose(diskfile);
    closefdiskfile--;

    if (status) {
      ffpmsg("Error writing compressed memory file (ftp_compress_open)");
      goto error;
    }
      
  } else {
    /* Opps, this should not have happened */
    ffpmsg("Can only compressed files here (ftp_compress_open)");
    goto error;
  }    
    

  signal(SIGALRM, SIG_DFL);
  alarm(0);
  return mem_seek(*handle,0);

 error:
  alarm(0); /* clear it */
  if (closeftpfile) {
    fclose(ftpfile);
  }
  if (closecommandfile) {
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  }
  if (closefdiskfile) {
    fclose(diskfile);
  }
  if (closememfile) {
    mem_close_free(*handle);
  }
  if (closediskfile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}